

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPResponse.cpp
# Opt level: O2

void __thiscall
HTTPResponse::HTTPResponse
          (HTTPResponse *this,int statusCode,string *status,string *contentType,string *content)

{
  char cVar1;
  int iVar2;
  int i;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  size_type sVar6;
  string header;
  stringstream ss;
  string local_1e8;
  string *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this->statusCode = statusCode;
  local_1c0 = &this->status;
  std::__cxx11::string::string((string *)local_1c0,(string *)status);
  std::__cxx11::string::string((string *)&this->contentType,(string *)contentType);
  this->responseSize = 0;
  local_1c8 = &this->contentType;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"HTTP/1.1 ");
  std::__cxx11::to_string(&local_1e8,statusCode);
  poVar3 = std::operator<<(local_1a8,(string *)&local_1e8);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string((string *)&local_1e8);
  poVar3 = std::operator<<(local_1a8,(string *)status);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(local_1a8,"Content-Type: ");
  poVar3 = std::operator<<(poVar3,(string *)contentType);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(local_1a8,"Content-Length: ");
  std::__cxx11::to_string(&local_1e8,content->_M_string_length);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  std::operator<<(poVar3,"\n\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  sVar6 = local_1e8._M_string_length;
  pcVar4 = (char *)operator_new__(local_1e8._M_string_length + content->_M_string_length + 4);
  this->response = pcVar4;
  for (uVar5 = 0; uVar5 < sVar6; uVar5 = uVar5 + 1) {
    cVar1 = local_1e8._M_dataplus._M_p[uVar5];
    iVar2 = this->responseSize;
    this->responseSize = iVar2 + 1;
    this->response[iVar2] = cVar1;
    sVar6 = local_1e8._M_string_length;
  }
  for (uVar5 = 0; uVar5 < content->_M_string_length; uVar5 = uVar5 + 1) {
    cVar1 = (content->_M_dataplus)._M_p[uVar5];
    iVar2 = this->responseSize;
    this->responseSize = iVar2 + 1;
    this->response[iVar2] = cVar1;
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

HTTPResponse::HTTPResponse(int statusCode, const std::string& status, const std::string& contentType, const std::string& content)
    : statusCode(statusCode), status(status), contentType(contentType)
{
    responseSize = 0;

    std::stringstream ss;
    ss << "HTTP/1.1 ";
    ss << std::to_string(statusCode) << " ";
    ss << status << "\n";
    ss << "Content-Type: " << contentType << "\n";
    ss << "Content-Length: " << std::to_string(content.size()) << "\n\n";

    std::string header = ss.str();
    this->response = new char[header.size() + content.size() + 4];
    for (int i = 0; i < header.size(); i++)
        response[responseSize++] = header[i];
    for (int i = 0; i < content.size(); i++)
        response[responseSize++] = content[i];
}